

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall
Board::draw_board(Board *this,set<Point,_std::less<Point>,_std::allocator<Point>_> *possible_moves,
                 map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
                 *possible_plays,Point *chosen,uint turn)

{
  bool bVar1;
  uint uVar2;
  shared_ptr<Piece> *__a;
  __shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  uchar foreground;
  uchar local_143;
  uchar local_141;
  uchar local_131;
  short local_10a;
  Point local_108;
  dimension y_1;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  Point local_b4;
  _Self local_b0;
  Point local_a4;
  _Self local_a0;
  _Self local_98;
  Point local_8c;
  _Self local_88;
  Point local_7a;
  short local_76;
  dimension j;
  short local_62;
  undefined1 local_60 [6];
  dimension i;
  set<Point,_std::less<Point>,_std::allocator<Point>_> threatened;
  uchar background;
  dimension y;
  uint turn_local;
  Point *chosen_local;
  map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
  *possible_plays_local;
  set<Point,_std::less<Point>,_std::allocator<Point>_> *possible_moves_local;
  Board *this_local;
  
  threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = turn;
  std::operator<<((ostream *)&std::cout,"  ");
  for (threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._2_2_ = 0;
      threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._2_2_ < 8;
      threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._2_2_ =
           threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._2_2_ + 1) {
    print_char_index((char)threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._2_2_ + 'A');
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  get_threatened((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_60,this,
                 possible_moves,possible_plays,chosen,
                 threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  for (local_62 = 7; -1 < local_62; local_62 = local_62 + -1) {
    print_index(local_62 + 1);
    for (local_76 = 0; local_76 < 8; local_76 = local_76 + 1) {
      Point::Point(&local_7a,local_76,local_62);
      bVar1 = Point::operator==(&local_7a,chosen);
      if (bVar1) {
        threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = 0xdc;
      }
      else {
        Point::Point(&local_8c,local_76,local_62);
        local_88._M_node =
             (_Base_ptr)
             std::set<Point,_std::less<Point>,_std::allocator<Point>_>::find
                       (possible_moves,&local_8c);
        local_98._M_node =
             (_Base_ptr)
             std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end(possible_moves);
        bVar1 = std::operator==(&local_88,&local_98);
        if (bVar1) {
          local_131 = 0xf5;
          if (((int)local_62 + (int)local_76) % 2 == 0) {
            local_131 = 0xf3;
          }
          threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = local_131;
        }
        else {
          Point::Point(&local_a4,local_76,local_62);
          local_a0._M_node =
               (_Base_ptr)
               std::set<Point,_std::less<Point>,_std::allocator<Point>_>::find
                         ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_60,&local_a4
                         );
          local_b0._M_node =
               (_Base_ptr)
               std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end
                         ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_60);
          bVar1 = std::operator!=(&local_a0,&local_b0);
          if (bVar1) {
            local_141 = 0xa0;
            if (((int)local_62 + (int)local_76) % 2 == 0) {
              local_141 = '|';
            }
            threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = local_141;
          }
          else {
            local_143 = '\"';
            if (((int)local_62 + (int)local_76) % 2 == 0) {
              local_143 = '\x1c';
            }
            threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = local_143;
          }
        }
      }
      Point::Point(&local_b4,local_76,local_62);
      __a = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,&local_b4);
      bVar1 = std::operator==(__a,(nullptr_t)0x0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"  ",&local_d9);
        print_colorful(&local_d8,'\0',
                       threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator(&local_d9);
      }
      else {
        Point::Point((Point *)&stack0xfffffffffffffefc,local_76,local_62);
        p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[]
                           (&this->m_board,(Point *)&stack0xfffffffffffffefc);
        peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        (*peVar4->_vptr_Piece[3])(&local_100);
        Point::Point(&local_108,local_76,local_62);
        p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[]
                           (&this->m_board,&local_108);
        peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        uVar2 = (*peVar4->_vptr_Piece[4])();
        foreground = '\0';
        if ((uVar2 & 1) != 0) {
          foreground = 0xff;
        }
        print_colorful(&local_100,foreground,
                       threatened._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_);
        std::__cxx11::string::~string((string *)&local_100);
      }
    }
    print_index(local_62 + 1);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"  ");
  for (local_10a = 0; local_10a < 8; local_10a = local_10a + 1) {
    print_char_index((char)local_10a + 'A');
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::set<Point,_std::less<Point>,_std::allocator<Point>_>::~set
            ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_60);
  return;
}

Assistant:

void Board::draw_board(const set<Point> &possible_moves, const map<Point, play> &possible_plays, const Point &chosen,
                       unsigned int turn) {
    cout << "  ";
    for (dimension y = 0; y < SIZE; y++) print_char_index((char) ('A' + y));
    cout << endl;
    unsigned char background;

#if DISPLAY_THREATENED
    auto threatened = get_threatened(possible_moves, possible_plays, chosen, turn);
#endif // DISPLAY_THREATENED

    for (dimension i = SIZE - 1; i >= 0; i--) {
        print_index(i + 1);
        for (dimension j = 0; j < SIZE; j++) {
            if (Point(j, i) == chosen) {
                background = 220;
#if DISPLAY_HINTS
            } else if ((possible_moves.find({j, i}) == possible_moves.end())) {
#else
                }
#endif // DISPLAY_HINTS
                background = (i + j) % 2 ? colors::light_gray : colors::dark_gray;
#if DISPLAY_HINTS
            } else {
#if DISPLAY_THREATENED
                if (threatened.find({j, i}) != threatened.end()) {
                    background = (i + j) % 2 ? colors::light_red : colors::dark_red;
                } else {
#endif // DISPLAY_THREATENED
                    background = (i + j) % 2 ? colors::light_green : colors::dark_green;
#if DISPLAY_THREATENED
                }
#endif // DISPLAY_THREATENED
            }
#endif // DISPLAY_HINTS

            if (m_board[{j, i}] == nullptr) {
                print_colorful("  ", colors::black, background);
            } else {
                print_colorful(m_board[{j, i}]->get_representation(),
                               (m_board[{j, i}]->get_color()) ? colors::white : colors::black, background);
            }
        }
        print_index(i + 1);
        cout << endl;
    }